

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeSync.h
# Opt level: O0

uint32_t __thiscall TimeSynchronizer::ToRemoteTime23(TimeSynchronizer *this,uint64_t localUsec)

{
  bool bVar1;
  __int_type_conflict _Var2;
  ulong in_RSI;
  Counter23 deltaTS23;
  Counter23 localTS23;
  Counter<unsigned_int,_23U> in_stack_ffffffffffffffb8;
  Counter<unsigned_int,_23U> in_stack_ffffffffffffffbc;
  Counter<unsigned_int,_23U> local_40;
  Counter<unsigned_int,_23U> local_3c;
  ulong local_38;
  uint32_t local_24;
  undefined1 *local_20;
  Counter<unsigned_int,_23U> *local_18;
  undefined1 *local_10;
  
  local_38 = in_RSI;
  bVar1 = std::atomic::operator_cast_to_bool
                    ((atomic<bool> *)
                     CONCAT44(in_stack_ffffffffffffffbc.Value,in_stack_ffffffffffffffb8.Value));
  if (bVar1) {
    Counter<unsigned_int,_23U>::Counter(&local_3c,(uint)(local_38 >> 3));
    _Var2 = std::__atomic_base::operator_cast_to_unsigned_int
                      ((__atomic_base<unsigned_int> *)
                       CONCAT44(in_stack_ffffffffffffffbc.Value,in_stack_ffffffffffffffb8.Value));
    Counter<unsigned_int,_23U>::Counter(&local_40,_Var2 >> 3);
    Counter<unsigned_int,_23U>::Counter
              ((Counter<unsigned_int,_23U> *)&stack0xffffffffffffffb8,&local_40);
    local_10 = &stack0xffffffffffffffbc;
    local_18 = &local_3c;
    local_20 = &stack0xffffffffffffffb8;
    Counter<unsigned_int,_23U>::Counter
              ((Counter<unsigned_int,_23U> *)&stack0xffffffffffffffbc,
               local_3c.Value + in_stack_ffffffffffffffb8.Value);
    local_24 = in_stack_ffffffffffffffbc.Value;
  }
  else {
    local_24 = 0;
  }
  return local_24;
}

Assistant:

inline uint32_t ToRemoteTime23(uint64_t localUsec)
    {
        if (!Synchronized) {
            return 0;
        }

        const Counter23 localTS23 = (uint32_t)(localUsec >> kTime23LostBits);
        const Counter23 deltaTS23 = RemoteTimeDeltaUsec >> kTime23LostBits;

        return (localTS23 + deltaTS23).ToUnsigned();
    }